

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O1

int4 __thiscall EmitXml::beginFunction(EmitXml *this,Funcdata *fd)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  char local_19;
  
  poVar1 = this->s;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<function ",10);
  pcVar2 = highlight[8];
  if (highlight[8] == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar3 = strlen(highlight[8]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar3);
  }
  local_19 = '>';
  std::__ostream_insert<char,std::char_traits<char>>(this->s,&local_19,1);
  return 0;
}

Assistant:

int4 EmitXml::beginFunction(const Funcdata *fd) {
  *s << "<function " << highlight[(int4)no_color];
  *s << '>';
  return 0;
}